

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O3

int lread(lua_State *L)

{
  int *piVar1;
  stm_copy *copy;
  int iVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)lua_touserdata(L,1);
  luaL_checktype(L,2,6);
  piVar1 = (int *)*puVar3;
  while( true ) {
    do {
    } while (*piVar1 != 0);
    LOCK();
    piVar1[1] = piVar1[1] + 1;
    UNLOCK();
    if (*piVar1 == 0) break;
    LOCK();
    piVar1[1] = piVar1[1] + -1;
    UNLOCK();
  }
  copy = *(stm_copy **)(piVar1 + 4);
  if (copy != (stm_copy *)0x0) {
    LOCK();
    iVar2 = copy->reference;
    copy->reference = copy->reference + 1;
    UNLOCK();
    if (iVar2 < 1) {
      __assert_fail("ref > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-stm.c"
                    ,0x61,"struct stm_copy *stm_copy(struct stm_object *)");
    }
  }
  LOCK();
  piVar1[1] = piVar1[1] + -1;
  UNLOCK();
  if (copy == (stm_copy *)puVar3[1]) {
    stm_releasecopy(copy);
  }
  else {
    stm_releasecopy((stm_copy *)puVar3[1]);
    puVar3[1] = copy;
    if (copy != (stm_copy *)0x0) {
      lua_settop(L,3);
      lua_copy(L,-1,1);
      lua_settop(L,-2);
      lua_settop(L,2);
      lua_pushlightuserdata(L,copy->msg);
      lua_pushinteger(L,(ulong)copy->sz);
      lua_pushvalue(L,1);
      lua_callk(L,3,-1,0,(lua_KFunction)0x0);
      lua_pushboolean(L,1);
      lua_copy(L,-1,1);
      lua_settop(L,-2);
      iVar2 = lua_gettop(L);
      return iVar2;
    }
  }
  lua_pushboolean(L,0);
  return 1;
}

Assistant:

static int
lread(lua_State *L) {
	struct boxreader * box = lua_touserdata(L, 1);
	luaL_checktype(L, 2, LUA_TFUNCTION);

	struct stm_copy * copy = stm_copy(box->obj);
	if (copy == box->lastcopy) {
		// not update
		stm_releasecopy(copy);
		lua_pushboolean(L, 0);
		return 1;
	}

	stm_releasecopy(box->lastcopy);
	box->lastcopy = copy;
	if (copy) {
		lua_settop(L, 3);
		lua_replace(L, 1);
		lua_settop(L, 2);
		lua_pushlightuserdata(L, copy->msg);
		lua_pushinteger(L, copy->sz);
		lua_pushvalue(L, 1);
		lua_call(L, 3, LUA_MULTRET);
		lua_pushboolean(L, 1);
		lua_replace(L, 1);
		return lua_gettop(L);
	} else {
		lua_pushboolean(L, 0);
		return 1;
	}
}